

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool __thiscall ON_NurbsSurface::IsClosed(ON_NurbsSurface *this,int dir)

{
  double *pointA;
  bool bVar1;
  int iVar2;
  double *pdVar3;
  double *pointA_00;
  uint uVar4;
  double *pdVar5;
  uint uVar6;
  
  if (((uint)dir < 2) && (0 < this->m_dim)) {
    bVar1 = ON_IsKnotVectorClamped
                      (this->m_order[(uint)dir],this->m_cv_count[(uint)dir],this->m_knot[(uint)dir],
                       2);
    if (!bVar1) {
      iVar2 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x31])
                        (this,(ulong)(uint)dir);
      return SUB41(iVar2,0);
    }
    pointA = this->m_cv;
    uVar4 = (this->m_cv_count[0] + -1) * this->m_cv_stride[0];
    pointA_00 = pointA + uVar4;
    if ((int)uVar4 < 0) {
      pointA_00 = (double *)0x0;
    }
    uVar6 = (this->m_cv_count[1] + -1) * this->m_cv_stride[1];
    pdVar5 = pointA + uVar6;
    if ((int)uVar6 < 0) {
      pdVar5 = (double *)0x0;
    }
    if (pointA == (double *)0x0) {
      pdVar5 = (double *)0x0;
      pointA_00 = (double *)0x0;
    }
    pdVar3 = pdVar5;
    if (dir == 0) {
      pdVar3 = pointA_00;
    }
    bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA,pdVar3);
    if (bVar1) {
      pdVar3 = (double *)0x0;
      if (-1 < (int)(uVar6 + uVar4)) {
        pdVar3 = pointA + (uVar6 + uVar4);
      }
      if (pointA == (double *)0x0) {
        pdVar3 = (double *)0x0;
      }
      if (dir == 0) {
        pointA_00 = pdVar5;
      }
      bVar1 = ON_PointsAreCoincident(this->m_dim,this->m_is_rat != 0,pointA_00,pdVar3);
      if (bVar1) {
        bVar1 = ON_IsPointGridClosed
                          (this->m_dim,this->m_is_rat != 0,this->m_cv_count[0],this->m_cv_count[1],
                           this->m_cv_stride[0],this->m_cv_stride[1],this->m_cv,dir);
        return bVar1;
      }
    }
  }
  return false;
}

Assistant:

bool 
ON_NurbsSurface::IsClosed( int dir ) const
{
  bool bIsClosed = false;
  if ( dir >= 0 && dir <= 1 && m_dim > 0 )
  {
    if ( ON_IsKnotVectorClamped( m_order[dir], m_cv_count[dir], m_knot[dir] ) )
    {
      const double* corners[4];
      corners[0] = CV(0,0);
      corners[(0==dir)?1:2] = CV(m_cv_count[0]-1,0);
      corners[(0==dir)?2:1] = CV(0,m_cv_count[1]-1);
      corners[3] = CV(m_cv_count[0]-1,m_cv_count[1]-1);
      if (    ON_PointsAreCoincident(m_dim,m_is_rat,corners[0],corners[1])
           && ON_PointsAreCoincident(m_dim,m_is_rat,corners[2],corners[3])
           && ON_IsPointGridClosed( m_dim, m_is_rat, m_cv_count[0], m_cv_count[1], m_cv_stride[0], m_cv_stride[1], m_cv, dir ) 
         )
      {
        bIsClosed = true;
      }
    }
    else if ( IsPeriodic(dir) )
    {
      bIsClosed = true;
    }
  }
  return bIsClosed;
}